

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O2

int __thiscall
TPZFrontMatrix<std::complex<long_double>,_TPZStackEqnStorage<std::complex<long_double>_>,_TPZFrontNonSym<std::complex<long_double>_>_>
::ClassId(TPZFrontMatrix<std::complex<long_double>,_TPZStackEqnStorage<std::complex<long_double>_>,_TPZFrontNonSym<std::complex<long_double>_>_>
          *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  allocator<char> aStack_5a561;
  string sStack_5a560;
  TPZFrontNonSym<std::complex<long_double>_> TStack_5a540;
  TPZStackEqnStorage<std::complex<long_double>_> TStack_5a418;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_5a560,"TPZFrontMatrix",&aStack_5a561);
  uVar1 = Hash(&sStack_5a560);
  iVar2 = TPZAbstractFrontMatrix<std::complex<long_double>_>::ClassId
                    (&this->super_TPZAbstractFrontMatrix<std::complex<long_double>_>);
  TPZStackEqnStorage<std::complex<long_double>_>::TPZStackEqnStorage(&TStack_5a418);
  iVar3 = TPZStackEqnStorage<std::complex<long_double>_>::ClassId(&TStack_5a418);
  TPZFrontNonSym<std::complex<long_double>_>::TPZFrontNonSym(&TStack_5a540);
  iVar4 = TPZFrontNonSym<std::complex<long_double>_>::ClassId(&TStack_5a540);
  TPZFrontNonSym<std::complex<long_double>_>::~TPZFrontNonSym(&TStack_5a540);
  TPZStackEqnStorage<std::complex<long_double>_>::~TPZStackEqnStorage(&TStack_5a418);
  std::__cxx11::string::~string((string *)&sStack_5a560);
  return iVar4 << 3 ^ iVar3 << 2 ^ iVar2 * 2 ^ uVar1;
}

Assistant:

int TPZFrontMatrix<TVar,store, front>::ClassId() const{
    return Hash("TPZFrontMatrix") ^ TPZAbstractFrontMatrix<TVar>::ClassId() << 1 ^ store().ClassId() << 2 ^ front().ClassId() << 3;
}